

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_soa.h
# Opt level: O2

GridSOA * embree::sse2::GridSOA::create<embree::FastAllocator::CachedAllocator>
                    (SubdivPatch1Base *patches,uint time_steps,uint x0,uint x1,uint y0,uint y1,
                    Scene *scene,CachedAllocator *alloc,BBox3fa *bounds_o)

{
  atomic<unsigned_long> *paVar1;
  FastAllocator *this;
  ThreadLocal *pTVar2;
  ThreadLocal2 *this_00;
  MutexSys *pMVar3;
  MutexSys *pMVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  GridSOA *this_01;
  uint uVar9;
  size_t sVar10;
  Lock<embree::MutexSys> local_88;
  GridRange range;
  MutexSys *local_60;
  size_t local_58;
  Lock<embree::MutexSys> local_50;
  ThreadLocal2 *local_40;
  range<int> local_38;
  
  uVar7 = x1 - x0;
  range.u_start = 0;
  range.v_start = 0;
  uVar9 = y1 - y0;
  range.u_end = uVar7;
  range.v_end = uVar9;
  if (time_steps == 1) {
    local_58 = getBVHBytes(&range,0x80,0);
  }
  else {
    sVar10 = getBVHBytes(&range,0xe0,0);
    local_38._begin = 0;
    local_38._end = time_steps - 1;
    local_58 = getTemporalBVHBytes(&local_38,0x100);
    local_58 = local_58 + sVar10 * (time_steps - 1);
  }
  sVar10 = (ulong)(uVar9 + 1) * (ulong)(uVar7 + 1) * 0x10;
  local_60 = (MutexSys *)(local_58 + (sVar10 + 8) * (ulong)time_steps + 0x30);
  this = alloc->alloc;
  pTVar2 = alloc->talloc0;
  this_00 = pTVar2->parent;
  if (this != (this_00->alloc)._M_b._M_p) {
    local_50.locked = true;
    local_50.mutex = &this_00->mutex;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (this == (FastAllocator *)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = this->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = this->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = this;
    UNLOCK();
    local_88.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_88.locked = true;
    local_40 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this->thread_local_allocators,&local_40);
    Lock<embree::MutexSys>::~Lock(&local_88);
    Lock<embree::MutexSys>::~Lock(&local_50);
  }
  pMVar4 = local_60;
  pTVar2->bytesUsed = (long)&local_60->mutex + pTVar2->bytesUsed;
  sVar5 = pTVar2->cur;
  uVar6 = (ulong)(-(int)sVar5 & 0xf);
  uVar8 = (long)&local_60->mutex + uVar6 + sVar5;
  pTVar2->cur = uVar8;
  if (pTVar2->end < uVar8) {
    pTVar2->cur = sVar5;
    pMVar3 = (MutexSys *)pTVar2->allocBlockSize;
    if ((MutexSys *)((long)local_60 * 4) < pMVar3 || (long)local_60 * 4 - (long)pMVar3 == 0) {
      local_88.mutex = pMVar3;
      this_01 = (GridSOA *)FastAllocator::malloc(this,(size_t)&local_88);
      pTVar2->ptr = (char *)this_01;
      sVar5 = (pTVar2->end - pTVar2->cur) + pTVar2->bytesWasted;
      pTVar2->bytesWasted = sVar5;
      pTVar2->end = (size_t)local_88.mutex;
      pTVar2->cur = (size_t)pMVar4;
      if (local_88.mutex < pMVar4) {
        pTVar2->cur = 0;
        local_88.mutex = (MutexSys *)pTVar2->allocBlockSize;
        this_01 = (GridSOA *)FastAllocator::malloc(this,(size_t)&local_88);
        pTVar2->ptr = (char *)this_01;
        sVar5 = (pTVar2->end - pTVar2->cur) + pTVar2->bytesWasted;
        pTVar2->bytesWasted = sVar5;
        pTVar2->end = (size_t)local_88.mutex;
        pTVar2->cur = (size_t)pMVar4;
        if (local_88.mutex < pMVar4) {
          pTVar2->cur = 0;
          this_01 = (GridSOA *)0x0;
          goto LAB_005f454f;
        }
      }
      pTVar2->bytesWasted = sVar5;
    }
    else {
      this_01 = (GridSOA *)FastAllocator::malloc(this,(size_t)&local_60);
    }
  }
  else {
    pTVar2->bytesWasted = pTVar2->bytesWasted + uVar6;
    this_01 = (GridSOA *)(pTVar2->ptr + (uVar8 - (long)local_60));
  }
LAB_005f454f:
  GridSOA(this_01,patches,time_steps,x0,x1,y0,y1,(uint)patches->grid_u_res,(uint)patches->grid_v_res
          ,(SubdivMesh *)(scene->geometries).items[patches->geom].ptr,local_58,sVar10,bounds_o);
  return this_01;
}

Assistant:

static GridSOA* create(const SubdivPatch1Base* patches, const unsigned time_steps,
                               unsigned x0, unsigned x1, unsigned y0, unsigned y1, 
                               const Scene* scene, Allocator& alloc, BBox3fa* bounds_o = nullptr)
      {
        const unsigned width = x1-x0+1;  
        const unsigned height = y1-y0+1; 
        const GridRange range(0,width-1,0,height-1);
        size_t bvhBytes = 0;
        if (time_steps == 1) 
          bvhBytes = getBVHBytes(range,sizeof(BVH4::AABBNode),0);
        else {
          bvhBytes = (time_steps-1)*getBVHBytes(range,sizeof(BVH4::AABBNodeMB),0);
          bvhBytes += getTemporalBVHBytes(make_range(0,int(time_steps-1)),sizeof(BVH4::AABBNodeMB4D));
        }
        const size_t gridBytes = 4*size_t(width)*size_t(height)*sizeof(float);  
        size_t rootBytes = time_steps*sizeof(BVH4::NodeRef);
#if !defined(__64BIT__)
        rootBytes += 4; // We read 2 elements behind the grid. As we store at least 8 root bytes after the grid we are fine in 64 bit mode. But in 32 bit mode we have to do additional padding.
#endif
        void* data = alloc(offsetof(GridSOA,data)+bvhBytes+time_steps*gridBytes+rootBytes);
        assert(data);
        return new (data) GridSOA(patches,time_steps,x0,x1,y0,y1,patches->grid_u_res,patches->grid_v_res,scene->get<SubdivMesh>(patches->geomID()),bvhBytes,gridBytes,bounds_o);
      }